

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined4 uVar4;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int *piVar34;
  _func_int **pp_Var35;
  _func_int *p_Var36;
  size_t sVar37;
  Layer *pLVar38;
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  unkbyte10 Var41;
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  unkbyte10 Var44;
  undefined1 auVar45 [14];
  undefined1 auVar46 [12];
  unkbyte10 Var47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  unkbyte10 Var60;
  int iVar61;
  int iVar62;
  int iVar63;
  Option *pOVar64;
  Mat *pMVar65;
  _func_int *p_Var66;
  ulong uVar67;
  long lVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  ulong uVar74;
  ulong uVar75;
  int outw;
  uint uVar76;
  uint uVar77;
  int iVar78;
  long lVar79;
  undefined8 *puVar80;
  long lVar81;
  ulong uVar82;
  uint uVar83;
  int iVar84;
  void *pvVar86;
  size_t sVar87;
  long lVar88;
  undefined8 *puVar89;
  void *pvVar90;
  int i;
  int iVar91;
  int iVar92;
  void *pvVar93;
  bool bVar94;
  char cVar104;
  char cVar105;
  int iVar95;
  char cVar106;
  char cVar107;
  char cVar109;
  char cVar110;
  int iVar108;
  int iVar111;
  int iVar112;
  undefined1 auVar96 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  int iVar123;
  float fVar124;
  undefined1 auVar125 [12];
  int iVar136;
  int iVar137;
  int iVar138;
  undefined1 auVar126 [16];
  undefined1 auVar134 [16];
  int iVar140;
  short sVar141;
  int iVar142;
  undefined1 auVar139 [16];
  int iVar143;
  undefined4 uVar144;
  short sVar150;
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  short sVar184;
  int iVar181;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  int iVar190;
  short sVar193;
  short sVar196;
  undefined1 auVar194 [12];
  short sVar199;
  undefined1 auVar197 [12];
  void *local_230;
  void *local_228;
  void *local_220;
  ulong local_218;
  float local_20c;
  void *local_208;
  void *local_200;
  int w;
  undefined4 uStack_1f4;
  Option *local_1f0;
  int local_1e4;
  Mat *local_1e0;
  void *local_1d8;
  Mat *local_1d0;
  Option opt_q;
  float scale_out;
  Mat top_blob_int32;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [56];
  int local_40;
  size_t local_38;
  undefined7 uVar6;
  undefined6 uVar8;
  undefined5 uVar10;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined3 uVar19;
  undefined3 uVar20;
  undefined3 uVar21;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined2 uVar27;
  ulong uVar85;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined6 uVar145;
  undefined8 uVar146;
  undefined1 auVar147 [12];
  undefined1 auVar148 [14];
  undefined1 auVar149 [16];
  undefined4 uVar151;
  undefined6 uVar152;
  undefined8 uVar153;
  undefined1 auVar154 [12];
  undefined1 auVar155 [14];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [12];
  undefined1 auVar183 [16];
  undefined1 auVar191 [12];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  
  local_78._24_4_ = bottom_blob->elempack;
  if (local_78._24_4_ == 0) {
    bVar94 = false;
  }
  else {
    bVar94 = ((int)bottom_blob->elemsize << 3) / (int)local_78._24_4_ == 8;
  }
  local_78._0_8_ = bottom_blob->data;
  piVar34 = bottom_blob->refcount;
  local_78._8_4_ = SUB84(piVar34,0);
  local_78._12_4_ = (undefined4)((ulong)piVar34 >> 0x20);
  local_78._16_8_ = bottom_blob->elemsize;
  local_78._32_8_ = bottom_blob->allocator;
  local_78._40_4_ = bottom_blob->dims;
  local_78._44_4_ = bottom_blob->w;
  local_78._48_4_ = bottom_blob->h;
  local_78._52_4_ = bottom_blob->d;
  local_40 = bottom_blob->c;
  local_38 = bottom_blob->cstep;
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + 1;
    UNLOCK();
  }
  if (!bVar94) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar2 = opt->workspace_allocator;
    uVar4 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar16 = opt->use_sgemm_convolution;
    uVar22 = opt->use_int8_inference;
    uVar28 = opt->use_vulkan_compute;
    uVar25 = CONCAT11(uVar28,uVar22);
    uVar19 = CONCAT21(uVar25,uVar16);
    uVar14 = CONCAT31(uVar19,uVar11);
    auVar113[0] = opt->use_bf16_storage;
    auVar113[1] = opt->use_fp16_packed;
    auVar113[2] = opt->use_fp16_storage;
    auVar113[3] = opt->use_fp16_arithmetic;
    auVar113[4] = opt->use_int8_packed;
    auVar113[5] = opt->use_int8_storage;
    auVar113[6] = opt->use_int8_arithmetic;
    auVar113[7] = opt->use_packing_layout;
    uVar3 = opt->use_shader_pack8;
    uVar5 = opt->use_subgroup_basic;
    uVar7 = opt->use_subgroup_vote;
    uVar9 = opt->use_subgroup_ballot;
    uVar12 = opt->use_subgroup_shuffle;
    uVar17 = opt->use_image_storage;
    uVar23 = opt->use_tensor_storage;
    uVar29 = opt->use_weight_fp16_storage;
    uVar26 = CONCAT11(uVar29,uVar23);
    uVar20 = CONCAT21(uVar26,uVar17);
    uVar15 = CONCAT31(uVar20,uVar12);
    uVar10 = CONCAT41(uVar15,uVar9);
    uVar8 = CONCAT51(uVar10,uVar7);
    uVar6 = CONCAT61(uVar8,uVar5);
    auVar113._8_8_ = CONCAT71(uVar6,uVar3);
    auVar134._0_4_ = opt->flush_denormals;
    auVar134[4] = opt->use_local_pool_allocator;
    auVar134[5] = opt->use_reserved_1;
    auVar134[6] = opt->use_reserved_2;
    auVar134[7] = opt->use_reserved_3;
    auVar134[8] = opt->use_reserved_4;
    auVar134[9] = opt->use_reserved_5;
    auVar134[10] = opt->use_reserved_6;
    auVar134[0xb] = opt->use_reserved_7;
    uVar13 = opt->use_reserved_8;
    uVar18 = opt->use_reserved_9;
    uVar24 = opt->use_reserved_10;
    uVar30 = opt->use_reserved_11;
    uVar27 = CONCAT11(uVar30,uVar24);
    uVar21 = CONCAT21(uVar27,uVar18);
    auVar134._12_4_ = CONCAT31(uVar21,uVar13);
    opt_q._48_12_ = auVar134._0_12_;
    opt_q._32_8_ = auVar113._0_8_;
    opt_q._40_4_ = SUB84(auVar113._8_8_,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.workspace_allocator = (Allocator *)uVar2;
    opt_q.openmp_blocktime = uVar4;
    opt_q._28_4_ = uVar14;
    opt_q._44_4_ = uVar15;
    opt_q._60_4_ = auVar134._12_4_;
    quantize_to_int8(bottom_blob,(Mat *)local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),&opt_q);
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
             (Mat *)local_78,&bottom_blob_bordered,opt);
  iVar32 = bottom_blob_bordered.c;
  iVar84 = bottom_blob_bordered.elempack;
  iVar95 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_001725fe;
  p_Var66 = this->_vptr_Convolution_x86[-3];
  iVar91 = (~((*(int *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar92 = (~((*(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var66) +
           1;
  sVar87 = 1;
  if (opt->use_packing_layout == true) {
    sVar87 = (size_t)((uint)(((byte)(p_Var66 + 0x30)[(long)&(this->weight_data_3x3_winograd63).data]
                             & 3) == 0) * 3 + 1);
  }
  local_1e4 = *(int *)(p_Var66 + 0x18 + (long)&(this->weight_data_int8).data);
  iVar33 = (int)sVar87;
  uVar67 = (ulong)(uint)(iVar33 * 4);
  if (100 < local_1e4) {
    uVar67 = sVar87;
  }
  Mat::create(top_blob,iVar91,iVar92,
              *(int *)(p_Var66 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) / iVar33,
              uVar67,iVar33,opt->blob_allocator);
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob->data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_001725fe;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32.elemsize = 0;
  top_blob_int32.elempack = 0;
  top_blob_int32.allocator = (Allocator *)0x0;
  top_blob_int32.dims = 0;
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  local_1f0 = opt;
  local_1e0 = top_blob;
  Mat::create(&top_blob_int32,iVar91,iVar92,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / iVar33,
              (ulong)(uint)(iVar33 * 4),iVar33,opt->workspace_allocator);
  iVar108 = bottom_blob_bordered.c;
  iVar92 = top_blob_int32.h;
  iVar91 = top_blob_int32.w;
  iVar95 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob_int32.data != (void *)0x0) &&
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob_int32.c * top_blob_int32.cstep != 0)) {
    if ((iVar84 == 8) && (iVar33 == 4)) {
      p_Var66 = this->_vptr_Convolution_x86[-3];
      uVar76 = *(uint *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((ulong)uVar76 == 1) {
        if ((((*(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1) &&
             (*(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var66) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1f0);
        }
        else {
          if ((((uVar76 != 1) ||
               ((*(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
                (*(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1))))
              || (*(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1))
             || ((*(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2 ||
                 (*(int *)((long)&this->convolution_dilation1 + (long)p_Var66) != 2))))
          goto LAB_00170e2d;
          conv1x1s2_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1f0);
        }
      }
      else {
LAB_00170e2d:
        uVar31 = *(uint *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar95 = *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        iVar111 = *(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar112 = *(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var66);
        _w = CONCAT44(uStack_1f4,bottom_blob_bordered.w);
        uVar75 = (ulong)(uint)bottom_blob_bordered.c;
        uVar67 = (ulong)(uint)top_blob_int32.w;
        pvVar86 = (void *)(ulong)(uint)top_blob_int32.h;
        if (local_1f0->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_weight_fp16_storage = false;
          opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
          Mat::create((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar76 * uVar31,
                      bottom_blob_bordered.c,8,8,local_1f0->workspace_allocator);
          local_1d0 = &this->weight_data_int8;
          if (0 < iVar108) {
            iVar108 = w * (int)local_208;
            local_1d8 = bottom_blob_bordered.data;
            local_208 = (void *)opt_q._0_8_;
            local_200 = (void *)((long)bottom_blob_bordered.w * (long)iVar111);
            local_230 = (void *)0x0;
            do {
              if (0 < (int)uVar31) {
                _w = bottom_blob_bordered.elemsize * (long)local_200;
                uVar82 = 0;
                puVar89 = (undefined8 *)opt_q._0_8_;
                do {
                  if (0 < (int)uVar76) {
                    uVar74 = 0;
                    do {
                      if (0 < iVar92) {
                        puVar80 = (undefined8 *)
                                  ((long)bottom_blob_bordered.data +
                                  uVar74 * (long)iVar95 * 8 +
                                  _w * uVar82 +
                                  bottom_blob_bordered.cstep * (long)local_230 *
                                  bottom_blob_bordered.elemsize);
                        iVar111 = 0;
                        do {
                          uVar85 = uVar67;
                          if (0 < iVar91) {
                            do {
                              *puVar89 = *puVar80;
                              puVar89 = puVar89 + 1;
                              puVar80 = puVar80 + iVar112;
                              uVar83 = (int)uVar85 - 1;
                              uVar85 = (ulong)uVar83;
                            } while (uVar83 != 0);
                          }
                          puVar80 = puVar80 + (iVar108 - iVar91 * iVar112);
                          iVar111 = iVar111 + 1;
                        } while (iVar111 != iVar92);
                      }
                      uVar74 = uVar74 + 1;
                    } while (uVar74 != uVar76);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar31);
              }
              local_230 = (void *)((long)local_230 + 1);
            } while (local_230 != (void *)uVar75);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,local_1d0,local_1f0);
          piVar34 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (opt_q._32_8_ == 0) {
                if (opt_q._0_8_ != 0) {
                  free((void *)opt_q._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
          local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
          uVar83 = uVar76 * uVar31;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar83,
                     (allocator_type *)&local_20c);
          if (0 < (int)uVar31) {
            iVar73 = 0;
            iVar69 = 0;
            uVar77 = 0;
            do {
              if (0 < (int)uVar76) {
                lVar79 = 0;
                do {
                  *(int *)(opt_q._0_8_ + (long)iVar73 * 4 + lVar79 * 4) = iVar69;
                  iVar69 = iVar69 + iVar95;
                  lVar79 = lVar79 + 1;
                } while (uVar76 != (uint)lVar79);
                iVar73 = iVar73 + (uint)lVar79;
              }
              iVar69 = iVar69 + (w * iVar111 - iVar95 * uVar76);
              uVar77 = uVar77 + 1;
            } while (uVar77 != uVar31);
          }
          if (0 < (int)local_1d0) {
            local_1d8 = (void *)((long)iVar91 * 4);
            local_230 = (void *)0x0;
            do {
              if (0 < iVar92) {
                local_220 = (void *)(top_blob_int32.cstep * (long)local_230 *
                                     top_blob_int32.elemsize + (long)top_blob_int32.data);
                local_200 = (void *)0x0;
                do {
                  if (0 < iVar91) {
                    _w = (long)local_200 * (long)local_208;
                    uVar82 = 0;
                    do {
                      if (iVar108 < 1) {
                        iVar123 = 0;
                        iVar136 = 0;
                        iVar137 = 0;
                        iVar138 = 0;
                        iVar71 = 0;
                        iVar78 = 0;
                        iVar70 = 0;
                        iVar72 = 0;
                        auVar139 = (undefined1  [16])0x0;
                        iVar95 = 0;
                        iVar111 = 0;
                        iVar73 = 0;
                        iVar69 = 0;
                      }
                      else {
                        pvVar93 = (void *)((this->weight_data_int8).cstep * (long)local_230 *
                                           (this->weight_data_int8).elemsize +
                                          (long)(this->weight_data_int8).data);
                        iVar95 = 0;
                        iVar111 = 0;
                        iVar73 = 0;
                        iVar69 = 0;
                        uVar74 = 0;
                        auVar139 = (undefined1  [16])0x0;
                        iVar71 = 0;
                        iVar78 = 0;
                        iVar70 = 0;
                        iVar72 = 0;
                        iVar123 = 0;
                        iVar136 = 0;
                        iVar137 = 0;
                        iVar138 = 0;
                        do {
                          if (0 < (int)uVar83) {
                            lVar79 = 0;
                            do {
                              uVar85 = *(ulong *)((long)bottom_blob_bordered.data +
                                                 (long)*(int *)(opt_q._0_8_ + lVar79) * 8 +
                                                 bottom_blob_bordered.elemsize *
                                                 bottom_blob_bordered.cstep * uVar74 +
                                                 (long)(iVar112 * 8 * (int)uVar82) +
                                                 _w * bottom_blob_bordered.elemsize *
                                                 (long)bottom_blob_bordered.w);
                              cVar104 = (char)(uVar85 >> 8);
                              cVar105 = (char)(uVar85 >> 0x10);
                              cVar106 = (char)(uVar85 >> 0x18);
                              cVar107 = (char)(uVar85 >> 0x20);
                              cVar109 = (char)(uVar85 >> 0x28);
                              cVar110 = (char)(uVar85 >> 0x30);
                              auVar180._8_6_ = 0;
                              auVar180._0_8_ = uVar85;
                              auVar180[0xe] = (char)(uVar85 >> 0x38);
                              auVar180[0xf] = -((long)uVar85 < 0);
                              auVar179._14_2_ = auVar180._14_2_;
                              auVar179._8_5_ = 0;
                              auVar179._0_8_ = uVar85;
                              auVar179[0xd] = -(cVar110 < '\0');
                              auVar178._13_3_ = auVar179._13_3_;
                              auVar178._8_4_ = 0;
                              auVar178._0_8_ = uVar85;
                              auVar178[0xc] = cVar110;
                              auVar177._12_4_ = auVar178._12_4_;
                              auVar177._8_3_ = 0;
                              auVar177._0_8_ = uVar85;
                              auVar177[0xb] = -(cVar109 < '\0');
                              auVar176._11_5_ = auVar177._11_5_;
                              auVar176._8_2_ = 0;
                              auVar176._0_8_ = uVar85;
                              auVar176[10] = cVar109;
                              auVar175._10_6_ = auVar176._10_6_;
                              auVar175[8] = 0;
                              auVar175._0_8_ = uVar85;
                              auVar175[9] = -(cVar107 < '\0');
                              auVar174._9_7_ = auVar175._9_7_;
                              auVar174[8] = cVar107;
                              auVar174._0_8_ = uVar85;
                              Var41 = CONCAT91(CONCAT81(auVar174._8_8_,-(cVar106 < '\0')),cVar106);
                              auVar40._2_10_ = Var41;
                              auVar40[1] = -(cVar105 < '\0');
                              auVar40[0] = cVar105;
                              auVar39._2_12_ = auVar40;
                              auVar39[1] = -(cVar104 < '\0');
                              auVar39[0] = cVar104;
                              auVar173._0_2_ = CONCAT11(-((char)uVar85 < '\0'),(char)uVar85);
                              auVar173._2_14_ = auVar39;
                              auVar113 = *(undefined1 (*) [16])((long)pvVar93 + lVar79 * 8);
                              auVar134 = *(undefined1 (*) [16])((long)pvVar93 + lVar79 * 8 + 0x10);
                              auVar171._0_14_ = auVar113._0_14_;
                              auVar171[0xe] = auVar113[7];
                              auVar171[0xf] = -(auVar113[7] < '\0');
                              auVar170._14_2_ = auVar171._14_2_;
                              auVar170._0_13_ = auVar113._0_13_;
                              auVar170[0xd] = -(auVar113[6] < '\0');
                              auVar169._13_3_ = auVar170._13_3_;
                              auVar169._0_12_ = auVar113._0_12_;
                              auVar169[0xc] = auVar113[6];
                              auVar168._12_4_ = auVar169._12_4_;
                              auVar168._0_11_ = auVar113._0_11_;
                              auVar168[0xb] = -(auVar113[5] < '\0');
                              auVar167._11_5_ = auVar168._11_5_;
                              auVar167._0_10_ = auVar113._0_10_;
                              auVar167[10] = auVar113[5];
                              auVar166._10_6_ = auVar167._10_6_;
                              auVar166._0_9_ = auVar113._0_9_;
                              auVar166[9] = -(auVar113[4] < '\0');
                              auVar165._9_7_ = auVar166._9_7_;
                              auVar165._0_8_ = auVar113._0_8_;
                              auVar165[8] = auVar113[4];
                              Var44 = CONCAT91(CONCAT81(auVar165._8_8_,-(auVar113[3] < '\0')),
                                               auVar113[3]);
                              auVar43._2_10_ = Var44;
                              auVar43[1] = -(auVar113[2] < '\0');
                              auVar43[0] = auVar113[2];
                              auVar42._2_12_ = auVar43;
                              auVar42[1] = -(auVar113[1] < '\0');
                              auVar42[0] = auVar113[1];
                              auVar164._0_2_ = CONCAT11(-(auVar113[0] < '\0'),auVar113[0]);
                              auVar164._2_14_ = auVar42;
                              sVar150 = CONCAT11(-(auVar113[8] < '\0'),auVar113[8]);
                              uVar151 = CONCAT13(-(auVar113[9] < '\0'),CONCAT12(auVar113[9],sVar150)
                                                );
                              uVar152 = CONCAT15(-(auVar113[10] < '\0'),
                                                 CONCAT14(auVar113[10],uVar151));
                              uVar153 = CONCAT17(-(auVar113[0xb] < '\0'),
                                                 CONCAT16(auVar113[0xb],uVar152));
                              auVar154._0_10_ =
                                   CONCAT19(-(auVar113[0xc] < '\0'),CONCAT18(auVar113[0xc],uVar153))
                              ;
                              auVar154[10] = auVar113[0xd];
                              auVar154[0xb] = -(auVar113[0xd] < '\0');
                              auVar155[0xc] = auVar113[0xe];
                              auVar155._0_12_ = auVar154;
                              auVar155[0xd] = -(auVar113[0xe] < '\0');
                              auVar156[0xe] = auVar113[0xf];
                              auVar156._0_14_ = auVar155;
                              auVar156[0xf] = -(auVar113[0xf] < '\0');
                              auVar162._0_14_ = auVar134._0_14_;
                              auVar162[0xe] = auVar134[7];
                              auVar162[0xf] = -(auVar134[7] < '\0');
                              auVar161._14_2_ = auVar162._14_2_;
                              auVar161._0_13_ = auVar134._0_13_;
                              auVar161[0xd] = -(auVar134[6] < '\0');
                              auVar160._13_3_ = auVar161._13_3_;
                              auVar160._0_12_ = auVar134._0_12_;
                              auVar160[0xc] = auVar134[6];
                              auVar172._12_4_ = auVar160._12_4_;
                              auVar172._0_11_ = auVar134._0_11_;
                              auVar172[0xb] = -(auVar134[5] < '\0');
                              auVar159._11_5_ = auVar172._11_5_;
                              auVar159._0_10_ = auVar134._0_10_;
                              auVar159[10] = auVar134[5];
                              auVar163._10_6_ = auVar159._10_6_;
                              auVar163._0_9_ = auVar134._0_9_;
                              auVar163[9] = -(auVar134[4] < '\0');
                              auVar158._9_7_ = auVar163._9_7_;
                              auVar158._0_8_ = auVar134._0_8_;
                              auVar158[8] = auVar134[4];
                              Var47 = CONCAT91(CONCAT81(auVar158._8_8_,-(auVar134[3] < '\0')),
                                               auVar134[3]);
                              auVar46._2_10_ = Var47;
                              auVar46[1] = -(auVar134[2] < '\0');
                              auVar46[0] = auVar134[2];
                              auVar45._2_12_ = auVar46;
                              auVar45[1] = -(auVar134[1] < '\0');
                              auVar45[0] = auVar134[1];
                              auVar157._0_2_ = CONCAT11(-(auVar134[0] < '\0'),auVar134[0]);
                              auVar157._2_14_ = auVar45;
                              sVar141 = CONCAT11(-(auVar134[8] < '\0'),auVar134[8]);
                              uVar144 = CONCAT13(-(auVar134[9] < '\0'),CONCAT12(auVar134[9],sVar141)
                                                );
                              uVar145 = CONCAT15(-(auVar134[10] < '\0'),
                                                 CONCAT14(auVar134[10],uVar144));
                              uVar146 = CONCAT17(-(auVar134[0xb] < '\0'),
                                                 CONCAT16(auVar134[0xb],uVar145));
                              auVar147._0_10_ =
                                   CONCAT19(-(auVar134[0xc] < '\0'),CONCAT18(auVar134[0xc],uVar146))
                              ;
                              auVar147[10] = auVar134[0xd];
                              auVar147[0xb] = -(auVar134[0xd] < '\0');
                              auVar148[0xc] = auVar134[0xe];
                              auVar148._0_12_ = auVar147;
                              auVar148[0xd] = -(auVar134[0xe] < '\0');
                              auVar149[0xe] = auVar134[0xf];
                              auVar149._0_14_ = auVar148;
                              auVar149[0xf] = -(auVar134[0xf] < '\0');
                              sVar184 = auVar39._0_2_;
                              sVar185 = auVar40._0_2_;
                              sVar199 = (short)Var41;
                              sVar186 = sVar199 * (short)Var44;
                              sVar187 = auVar174._8_2_;
                              sVar188 = auVar176._10_2_;
                              sVar189 = auVar178._12_2_;
                              auVar172 = pmulhw(auVar164,auVar173);
                              sVar193 = sVar199 * (short)((ulong)uVar153 >> 0x30);
                              auVar134 = pmulhw(auVar156,auVar173);
                              sVar196 = sVar199 * (short)Var47;
                              auVar163 = pmulhw(auVar157,auVar173);
                              sVar199 = sVar199 * (short)((ulong)uVar146 >> 0x30);
                              auVar113 = pmulhw(auVar149,auVar173);
                              iVar190 = CONCAT22(auVar172._6_2_,sVar186);
                              Var41 = CONCAT64(CONCAT42(iVar190,auVar172._4_2_),
                                               CONCAT22(sVar185 * auVar43._0_2_,sVar186));
                              auVar48._4_8_ = (long)((unkuint10)Var41 >> 0x10);
                              auVar48._2_2_ = auVar172._2_2_;
                              auVar48._0_2_ = sVar184 * auVar42._0_2_;
                              iVar61 = CONCAT22(auVar134._6_2_,sVar193);
                              Var44 = CONCAT64(CONCAT42(iVar61,auVar134._4_2_),
                                               CONCAT22(sVar185 * (short)((uint6)uVar152 >> 0x20),
                                                        sVar193));
                              auVar49._4_8_ = (long)((unkuint10)Var44 >> 0x10);
                              auVar49._2_2_ = auVar134._2_2_;
                              auVar49._0_2_ = sVar184 * (short)((uint)uVar151 >> 0x10);
                              iVar140 = auVar139._4_4_;
                              iVar142 = auVar139._8_4_;
                              iVar143 = auVar139._12_4_;
                              iVar62 = CONCAT22(auVar163._6_2_,sVar196);
                              Var47 = CONCAT64(CONCAT42(iVar62,auVar163._4_2_),
                                               CONCAT22(sVar185 * auVar46._0_2_,sVar196));
                              auVar50._4_8_ = (long)((unkuint10)Var47 >> 0x10);
                              auVar50._2_2_ = auVar163._2_2_;
                              auVar50._0_2_ = sVar184 * auVar45._0_2_;
                              iVar63 = CONCAT22(auVar113._6_2_,sVar199);
                              Var60 = CONCAT64(CONCAT42(iVar63,auVar113._4_2_),
                                               CONCAT22(sVar185 * (short)((uint6)uVar145 >> 0x20),
                                                        sVar199));
                              auVar51._4_8_ = (long)((unkuint10)Var60 >> 0x10);
                              auVar51._2_2_ = auVar113._2_2_;
                              auVar51._0_2_ = sVar184 * (short)((uint)uVar144 >> 0x10);
                              iVar181 = CONCAT22(auVar172._8_2_,sVar187 * auVar165._8_2_);
                              auVar182._0_8_ =
                                   CONCAT26(auVar172._10_2_,
                                            CONCAT24(sVar188 * auVar167._10_2_,iVar181));
                              auVar182._8_2_ = sVar189 * auVar169._12_2_;
                              auVar182._10_2_ = auVar172._12_2_;
                              auVar183._12_2_ = auVar179._14_2_ * auVar170._14_2_;
                              auVar183._0_12_ = auVar182;
                              auVar183._14_2_ = auVar172._14_2_;
                              iVar95 = iVar181 + CONCAT22(auVar172._0_2_,
                                                          auVar173._0_2_ * auVar164._0_2_) + iVar95;
                              iVar111 = (int)((ulong)auVar182._0_8_ >> 0x20) +
                                        auVar48._0_4_ + iVar111;
                              iVar73 = auVar182._8_4_ + (int)((unkuint10)Var41 >> 0x10) + iVar73;
                              iVar69 = auVar183._12_4_ + iVar190 + iVar69;
                              iVar190 = CONCAT22(auVar134._8_2_,
                                                 sVar187 * (short)((unkuint10)auVar154._0_10_ >>
                                                                  0x40));
                              auVar191._0_8_ =
                                   CONCAT26(auVar134._10_2_,
                                            CONCAT24(sVar188 * auVar154._10_2_,iVar190));
                              auVar191._8_2_ = sVar189 * auVar155._12_2_;
                              auVar191._10_2_ = auVar134._12_2_;
                              auVar192._12_2_ = auVar179._14_2_ * auVar156._14_2_;
                              auVar192._0_12_ = auVar191;
                              auVar192._14_2_ = auVar134._14_2_;
                              auVar139._0_4_ =
                                   iVar190 + CONCAT22(auVar134._0_2_,auVar173._0_2_ * sVar150) +
                                             auVar139._0_4_;
                              auVar139._4_4_ =
                                   (int)((ulong)auVar191._0_8_ >> 0x20) + auVar49._0_4_ + iVar140;
                              auVar139._8_4_ =
                                   auVar191._8_4_ + (int)((unkuint10)Var44 >> 0x10) + iVar142;
                              auVar139._12_4_ = auVar192._12_4_ + iVar61 + iVar143;
                              iVar190 = CONCAT22(auVar163._8_2_,sVar187 * auVar158._8_2_);
                              auVar194._0_8_ =
                                   CONCAT26(auVar163._10_2_,
                                            CONCAT24(sVar188 * auVar159._10_2_,iVar190));
                              auVar194._8_2_ = sVar189 * auVar160._12_2_;
                              auVar194._10_2_ = auVar163._12_2_;
                              auVar195._12_2_ = auVar179._14_2_ * auVar161._14_2_;
                              auVar195._0_12_ = auVar194;
                              auVar195._14_2_ = auVar163._14_2_;
                              iVar71 = iVar190 + CONCAT22(auVar163._0_2_,
                                                          auVar173._0_2_ * auVar157._0_2_) + iVar71;
                              iVar78 = (int)((ulong)auVar194._0_8_ >> 0x20) + auVar50._0_4_ + iVar78
                              ;
                              iVar70 = auVar194._8_4_ + (int)((unkuint10)Var47 >> 0x10) + iVar70;
                              iVar72 = auVar195._12_4_ + iVar62 + iVar72;
                              iVar190 = CONCAT22(auVar113._8_2_,
                                                 sVar187 * (short)((unkuint10)auVar147._0_10_ >>
                                                                  0x40));
                              auVar197._0_8_ =
                                   CONCAT26(auVar113._10_2_,
                                            CONCAT24(sVar188 * auVar147._10_2_,iVar190));
                              auVar197._8_2_ = sVar189 * auVar148._12_2_;
                              auVar197._10_2_ = auVar113._12_2_;
                              auVar198._12_2_ = auVar179._14_2_ * auVar149._14_2_;
                              auVar198._0_12_ = auVar197;
                              auVar198._14_2_ = auVar113._14_2_;
                              iVar123 = iVar190 + CONCAT22(auVar113._0_2_,auVar173._0_2_ * sVar141)
                                                  + iVar123;
                              iVar136 = (int)((ulong)auVar197._0_8_ >> 0x20) +
                                        auVar51._0_4_ + iVar136;
                              iVar137 = auVar197._8_4_ + (int)((unkuint10)Var60 >> 0x10) + iVar137;
                              iVar138 = auVar198._12_4_ + iVar63 + iVar138;
                              lVar79 = lVar79 + 4;
                            } while ((ulong)uVar83 << 2 != lVar79);
                            pvVar93 = (void *)((long)pvVar93 + (ulong)uVar83 * 0x20);
                          }
                          uVar74 = uVar74 + 1;
                        } while (uVar74 != uVar75);
                      }
                      piVar34 = (int *)((long)local_220 + uVar82 * 0x10);
                      *piVar34 = iVar69 + iVar73 + iVar111 + iVar95;
                      piVar34[1] = auVar139._12_4_ + auVar139._8_4_ +
                                   auVar139._4_4_ + auVar139._0_4_;
                      piVar34[2] = iVar72 + iVar70 + iVar78 + iVar71;
                      piVar34[3] = iVar138 + iVar137 + iVar136 + iVar123;
                      uVar82 = uVar82 + 1;
                    } while (uVar82 != uVar67);
                  }
                  local_220 = (void *)((long)local_220 + (long)iVar91 * 0x10);
                  local_200 = (void *)((long)local_200 + 1);
                } while (local_200 != pvVar86);
              }
              local_230 = (void *)((long)local_230 + 1);
            } while ((Mat *)local_230 != local_1d0);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
        }
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pMVar65 = local_1e0;
      pOVar64 = local_1f0;
      pp_Var35 = this->_vptr_Convolution_x86;
      p_Var36 = pp_Var35[-3];
      p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
      if (0 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar79 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
          fVar124 = 0.0;
          if (fVar1 != 0.0) {
            fVar124 = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar79 * 4) = fVar124;
          lVar79 = lVar79 + 1;
          p_Var36 = pp_Var35[-3];
          p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
        } while (lVar79 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1e4 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x1a8),local_1f0);
        pLVar38 = this->activation;
        if (pLVar38 != (Layer *)0x0) {
          (*pLVar38->_vptr_Layer[9])(pLVar38,pMVar65,pOVar64);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x280),
                   (Mat *)(p_Var66 + 0x1a8),*(int *)(p_Var66 + 0x10c),(Mat *)(p_Var66 + 0x110),
                   local_1f0);
      }
      piVar34 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar92 = bottom_blob_bordered.c;
    iVar91 = bottom_blob_bordered.w;
    iVar95 = top_blob_int32.w;
    if ((iVar84 == 1) && (iVar33 == 4)) {
      p_Var66 = this->_vptr_Convolution_x86[-3];
      iVar108 = *(int *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar111 = *(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar112 = *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar73 = *(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      _w = (long)*(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var66);
      uVar67 = (ulong)(uint)bottom_blob_bordered.c;
      lVar79 = (long)top_blob_int32.w;
      local_200 = (void *)(ulong)(uint)top_blob_int32.h;
      local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
      uVar76 = iVar108 * iVar111;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                 (allocator_type *)&local_20c);
      if (0 < iVar111) {
        iVar69 = 0;
        iVar71 = 0;
        iVar78 = 0;
        do {
          if (0 < iVar108) {
            lVar81 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar69 * 4 + lVar81 * 4) = iVar71;
              iVar71 = iVar71 + iVar112;
              lVar81 = lVar81 + 1;
            } while (iVar108 != (int)lVar81);
            iVar69 = iVar69 + (int)lVar81;
          }
          iVar71 = iVar71 + (iVar91 * iVar73 - iVar112 * iVar108);
          iVar78 = iVar78 + 1;
        } while (iVar78 != iVar111);
      }
      if (0 < (int)local_1d0) {
        local_1d8 = (void *)(lVar79 * 4);
        local_220 = (void *)0x0;
        do {
          if (0 < (int)local_200) {
            pvVar86 = (void *)(top_blob_int32.cstep * (long)local_220 * top_blob_int32.elemsize +
                              (long)top_blob_int32.data);
            local_230 = (void *)0x0;
            do {
              if (0 < iVar95) {
                lVar81 = 0;
                do {
                  if (iVar92 < 1) {
                    iVar91 = 0;
                    iVar108 = 0;
                    iVar111 = 0;
                    iVar112 = 0;
                  }
                  else {
                    pvVar93 = (void *)((this->weight_data_int8).cstep * (long)local_220 *
                                       (this->weight_data_int8).elemsize +
                                      (long)(this->weight_data_int8).data);
                    iVar91 = 0;
                    iVar108 = 0;
                    iVar111 = 0;
                    iVar112 = 0;
                    uVar75 = 0;
                    do {
                      if (0 < (int)uVar76) {
                        uVar82 = 0;
                        do {
                          auVar113 = ZEXT416((uint)(int)*(char *)((long)bottom_blob_bordered.data +
                                                                 (long)*(int *)(opt_q._0_8_ +
                                                                               uVar82 * 4) +
                                                                 bottom_blob_bordered.cstep *
                                                                 bottom_blob_bordered.elemsize *
                                                                 uVar75 + lVar81 * _w +
                                                                          (long)bottom_blob_bordered
                                                                                .w *
                                                                          (long)local_230 *
                                                                          (long)local_208 *
                                                                          bottom_blob_bordered.
                                                                          elemsize));
                          auVar113 = pshuflw(auVar113,auVar113,0);
                          auVar114._0_4_ = auVar113._0_4_;
                          auVar114._4_4_ = auVar114._0_4_;
                          auVar114._8_4_ = auVar114._0_4_;
                          auVar114._12_4_ = auVar114._0_4_;
                          uVar74 = *(ulong *)((long)pvVar93 + uVar82 * 4);
                          cVar104 = (char)(uVar74 >> 8);
                          cVar105 = (char)(uVar74 >> 0x10);
                          cVar106 = (char)(uVar74 >> 0x18);
                          cVar107 = (char)(uVar74 >> 0x20);
                          cVar109 = (char)(uVar74 >> 0x28);
                          cVar110 = (char)(uVar74 >> 0x30);
                          auVar133._8_6_ = 0;
                          auVar133._0_8_ = uVar74;
                          auVar133[0xe] = (char)(uVar74 >> 0x38);
                          auVar133[0xf] = -((long)uVar74 < 0);
                          auVar132._14_2_ = auVar133._14_2_;
                          auVar132._8_5_ = 0;
                          auVar132._0_8_ = uVar74;
                          auVar132[0xd] = -(cVar110 < '\0');
                          auVar131._13_3_ = auVar132._13_3_;
                          auVar131._8_4_ = 0;
                          auVar131._0_8_ = uVar74;
                          auVar131[0xc] = cVar110;
                          auVar130._12_4_ = auVar131._12_4_;
                          auVar130._8_3_ = 0;
                          auVar130._0_8_ = uVar74;
                          auVar130[0xb] = -(cVar109 < '\0');
                          auVar129._11_5_ = auVar130._11_5_;
                          auVar129._8_2_ = 0;
                          auVar129._0_8_ = uVar74;
                          auVar129[10] = cVar109;
                          auVar128._10_6_ = auVar129._10_6_;
                          auVar128[8] = 0;
                          auVar128._0_8_ = uVar74;
                          auVar128[9] = -(cVar107 < '\0');
                          auVar127._9_7_ = auVar128._9_7_;
                          auVar127[8] = cVar107;
                          auVar127._0_8_ = uVar74;
                          Var41 = CONCAT91(CONCAT81(auVar127._8_8_,-(cVar106 < '\0')),cVar106);
                          auVar53._2_10_ = Var41;
                          auVar53[1] = -(cVar105 < '\0');
                          auVar53[0] = cVar105;
                          auVar52._2_12_ = auVar53;
                          auVar52[1] = -(cVar104 < '\0');
                          auVar52[0] = cVar104;
                          auVar126._0_2_ = CONCAT11(-((char)uVar74 < '\0'),(char)uVar74);
                          auVar126._2_14_ = auVar52;
                          sVar141 = auVar113._2_2_ * (short)Var41;
                          auVar134 = pmulhw(auVar126,auVar114);
                          iVar73 = CONCAT22(auVar134._6_2_,sVar141);
                          Var41 = CONCAT64(CONCAT42(iVar73,auVar134._4_2_),
                                           CONCAT22(auVar113._0_2_ * auVar53._0_2_,sVar141));
                          auVar54._4_8_ = (long)((unkuint10)Var41 >> 0x10);
                          auVar54._2_2_ = auVar134._2_2_;
                          auVar54._0_2_ = auVar113._2_2_ * auVar52._0_2_;
                          iVar91 = iVar91 + CONCAT22(auVar134._0_2_,auVar113._0_2_ * auVar126._0_2_)
                          ;
                          iVar108 = iVar108 + auVar54._0_4_;
                          iVar111 = iVar111 + (int)((unkuint10)Var41 >> 0x10);
                          iVar112 = iVar112 + iVar73;
                          uVar82 = uVar82 + 1;
                        } while (uVar76 != uVar82);
                        pvVar93 = (void *)((long)pvVar93 + (ulong)uVar76 * 4);
                      }
                      uVar75 = uVar75 + 1;
                    } while (uVar75 != uVar67);
                  }
                  piVar34 = (int *)((long)pvVar86 + lVar81 * 0x10);
                  *piVar34 = iVar91;
                  piVar34[1] = iVar108;
                  piVar34[2] = iVar111;
                  piVar34[3] = iVar112;
                  lVar81 = lVar81 + 1;
                } while (lVar81 != lVar79);
              }
              pvVar86 = (void *)((long)pvVar86 + lVar79 * 0x10);
              local_230 = (void *)((long)local_230 + 1);
            } while (local_230 != local_200);
          }
          local_220 = (void *)((long)local_220 + 1);
        } while ((Mat *)local_220 != local_1d0);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pMVar65 = local_1e0;
      pOVar64 = local_1f0;
      pp_Var35 = this->_vptr_Convolution_x86;
      p_Var36 = pp_Var35[-3];
      p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
      if (0 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar79 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
          fVar124 = 0.0;
          if (fVar1 != 0.0) {
            fVar124 = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar79 * 4) = fVar124;
          lVar79 = lVar79 + 1;
          p_Var36 = pp_Var35[-3];
          p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
        } while (lVar79 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1e4 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x1a8),local_1f0);
        pLVar38 = this->activation;
        if (pLVar38 != (Layer *)0x0) {
          (*pLVar38->_vptr_Layer[9])(pLVar38,pMVar65,pOVar64);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x280),
                   (Mat *)(p_Var66 + 0x1a8),*(int *)(p_Var66 + 0x10c),(Mat *)(p_Var66 + 0x110),
                   local_1f0);
      }
      piVar34 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar108 = bottom_blob_bordered.c;
    iVar92 = bottom_blob_bordered.w;
    iVar91 = top_blob_int32.c;
    iVar95 = top_blob_int32.w;
    if ((iVar84 == 8) && (iVar33 == 1)) {
      p_Var66 = this->_vptr_Convolution_x86[-3];
      iVar111 = *(int *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar112 = *(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar73 = *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar69 = *(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar71 = *(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var66);
      uVar67 = (ulong)(uint)bottom_blob_bordered.c;
      lVar79 = (long)top_blob_int32.w;
      local_1d8 = (void *)(ulong)(uint)top_blob_int32.h;
      pvVar86 = (void *)(ulong)(uint)top_blob_int32.c;
      uVar76 = iVar111 * iVar112;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                 (allocator_type *)&local_20c);
      if (0 < iVar112) {
        iVar78 = 0;
        iVar70 = 0;
        iVar72 = 0;
        do {
          if (0 < iVar111) {
            lVar81 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar78 * 4 + lVar81 * 4) = iVar70;
              iVar70 = iVar70 + iVar73;
              lVar81 = lVar81 + 1;
            } while (iVar111 != (int)lVar81);
            iVar78 = iVar78 + (int)lVar81;
          }
          iVar70 = iVar70 + (iVar92 * iVar69 - iVar73 * iVar111);
          iVar72 = iVar72 + 1;
        } while (iVar72 != iVar112);
      }
      if (0 < iVar91) {
        local_208 = (void *)0x0;
        do {
          if (0 < (int)local_1d8) {
            local_228 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * (long)local_208 +
                                (long)top_blob_int32.data);
            local_200 = (void *)0x0;
            do {
              if (0 < iVar95) {
                sVar87 = (this->weight_data_int8).cstep;
                _w = (long)local_200 * (long)local_1d0;
                sVar37 = (this->weight_data_int8).elemsize;
                pvVar93 = (this->weight_data_int8).data;
                lVar81 = 0;
                do {
                  if (iVar108 < 1) {
                    iVar91 = 0;
                  }
                  else {
                    uVar75 = 0;
                    iVar91 = 0;
                    pvVar90 = (void *)(sVar87 * sVar37 * (long)local_208 + (long)pvVar93);
                    do {
                      if (0 < (int)uVar76) {
                        uVar82 = 0;
                        do {
                          uVar74 = *(ulong *)((long)bottom_blob_bordered.data +
                                             (long)*(int *)(opt_q._0_8_ + uVar82 * 4) * 8 +
                                             bottom_blob_bordered.elemsize *
                                             bottom_blob_bordered.cstep * uVar75 +
                                             (long)(iVar71 * 8 * (int)lVar81) +
                                             _w * bottom_blob_bordered.elemsize *
                                             (long)bottom_blob_bordered.w);
                          cVar104 = (char)(uVar74 >> 8);
                          cVar105 = (char)(uVar74 >> 0x10);
                          cVar106 = (char)(uVar74 >> 0x18);
                          cVar107 = (char)(uVar74 >> 0x20);
                          cVar109 = (char)(uVar74 >> 0x28);
                          cVar110 = (char)(uVar74 >> 0x30);
                          auVar103._8_6_ = 0;
                          auVar103._0_8_ = uVar74;
                          auVar103[0xe] = (char)(uVar74 >> 0x38);
                          auVar103[0xf] = -((long)uVar74 < 0);
                          auVar102._14_2_ = auVar103._14_2_;
                          auVar102._8_5_ = 0;
                          auVar102._0_8_ = uVar74;
                          auVar102[0xd] = -(cVar110 < '\0');
                          auVar101._13_3_ = auVar102._13_3_;
                          auVar101._8_4_ = 0;
                          auVar101._0_8_ = uVar74;
                          auVar101[0xc] = cVar110;
                          auVar100._12_4_ = auVar101._12_4_;
                          auVar100._8_3_ = 0;
                          auVar100._0_8_ = uVar74;
                          auVar100[0xb] = -(cVar109 < '\0');
                          auVar99._11_5_ = auVar100._11_5_;
                          auVar99._8_2_ = 0;
                          auVar99._0_8_ = uVar74;
                          auVar99[10] = cVar109;
                          auVar98._10_6_ = auVar99._10_6_;
                          auVar98[8] = 0;
                          auVar98._0_8_ = uVar74;
                          auVar98[9] = -(cVar107 < '\0');
                          auVar97._9_7_ = auVar98._9_7_;
                          auVar97[8] = cVar107;
                          auVar97._0_8_ = uVar74;
                          Var41 = CONCAT91(CONCAT81(auVar97._8_8_,-(cVar106 < '\0')),cVar106);
                          auVar56._2_10_ = Var41;
                          auVar56[1] = -(cVar105 < '\0');
                          auVar56[0] = cVar105;
                          auVar55._2_12_ = auVar56;
                          auVar55[1] = -(cVar104 < '\0');
                          auVar55[0] = cVar104;
                          auVar96._0_2_ = CONCAT11(-((char)uVar74 < '\0'),(char)uVar74);
                          auVar96._2_14_ = auVar55;
                          uVar74 = *(ulong *)((long)pvVar90 + uVar82 * 8);
                          cVar104 = (char)(uVar74 >> 8);
                          cVar105 = (char)(uVar74 >> 0x10);
                          cVar106 = (char)(uVar74 >> 0x18);
                          cVar107 = (char)(uVar74 >> 0x20);
                          cVar109 = (char)(uVar74 >> 0x28);
                          cVar110 = (char)(uVar74 >> 0x30);
                          auVar122._8_6_ = 0;
                          auVar122._0_8_ = uVar74;
                          auVar122[0xe] = (char)(uVar74 >> 0x38);
                          auVar122[0xf] = -((long)uVar74 < 0);
                          auVar121._14_2_ = auVar122._14_2_;
                          auVar121._8_5_ = 0;
                          auVar121._0_8_ = uVar74;
                          auVar121[0xd] = -(cVar110 < '\0');
                          auVar120._13_3_ = auVar121._13_3_;
                          auVar120._8_4_ = 0;
                          auVar120._0_8_ = uVar74;
                          auVar120[0xc] = cVar110;
                          auVar119._12_4_ = auVar120._12_4_;
                          auVar119._8_3_ = 0;
                          auVar119._0_8_ = uVar74;
                          auVar119[0xb] = -(cVar109 < '\0');
                          auVar118._11_5_ = auVar119._11_5_;
                          auVar118._8_2_ = 0;
                          auVar118._0_8_ = uVar74;
                          auVar118[10] = cVar109;
                          auVar117._10_6_ = auVar118._10_6_;
                          auVar117[8] = 0;
                          auVar117._0_8_ = uVar74;
                          auVar117[9] = -(cVar107 < '\0');
                          auVar116._9_7_ = auVar117._9_7_;
                          auVar116[8] = cVar107;
                          auVar116._0_8_ = uVar74;
                          Var44 = CONCAT91(CONCAT81(auVar116._8_8_,-(cVar106 < '\0')),cVar106);
                          auVar58._2_10_ = Var44;
                          auVar58[1] = -(cVar105 < '\0');
                          auVar58[0] = cVar105;
                          auVar57._2_12_ = auVar58;
                          auVar57[1] = -(cVar104 < '\0');
                          auVar57[0] = cVar104;
                          auVar115._0_2_ = CONCAT11(-((char)uVar74 < '\0'),(char)uVar74);
                          auVar115._2_14_ = auVar57;
                          sVar141 = (short)Var44 * (short)Var41;
                          auVar113 = pmulhw(auVar115,auVar96);
                          iVar92 = CONCAT22(auVar113._6_2_,sVar141);
                          Var41 = CONCAT64(CONCAT42(iVar92,auVar113._4_2_),
                                           CONCAT22(auVar58._0_2_ * auVar56._0_2_,sVar141));
                          auVar59._4_8_ = (long)((unkuint10)Var41 >> 0x10);
                          auVar59._2_2_ = auVar113._2_2_;
                          auVar59._0_2_ = auVar57._0_2_ * auVar55._0_2_;
                          iVar111 = CONCAT22(auVar113._8_2_,auVar116._8_2_ * auVar97._8_2_);
                          auVar125._0_8_ =
                               CONCAT26(auVar113._10_2_,
                                        CONCAT24(auVar118._10_2_ * auVar99._10_2_,iVar111));
                          auVar125._8_2_ = auVar120._12_2_ * auVar101._12_2_;
                          auVar125._10_2_ = auVar113._12_2_;
                          auVar135._12_2_ = auVar121._14_2_ * auVar102._14_2_;
                          auVar135._0_12_ = auVar125;
                          auVar135._14_2_ = auVar113._14_2_;
                          iVar91 = iVar91 + auVar135._12_4_ + iVar92 +
                                            (int)((ulong)auVar125._0_8_ >> 0x20) + auVar59._0_4_ +
                                            auVar125._8_4_ + (int)((unkuint10)Var41 >> 0x10) +
                                            iVar111 + CONCAT22(auVar113._0_2_,
                                                               auVar115._0_2_ * auVar96._0_2_);
                          uVar82 = uVar82 + 1;
                        } while (uVar76 != uVar82);
                        pvVar90 = (void *)((long)pvVar90 + (ulong)uVar76 * 8);
                      }
                      uVar75 = uVar75 + 1;
                    } while (uVar75 != uVar67);
                  }
                  *(int *)((long)local_228 + lVar81 * 4) = iVar91;
                  lVar81 = lVar81 + 1;
                } while (lVar81 != lVar79);
              }
              local_228 = (void *)((long)local_228 + lVar79 * 4);
              local_200 = (void *)((long)local_200 + 1);
            } while (local_200 != local_1d8);
          }
          local_208 = (void *)((long)local_208 + 1);
        } while (local_208 != pvVar86);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pMVar65 = local_1e0;
      pOVar64 = local_1f0;
      pp_Var35 = this->_vptr_Convolution_x86;
      p_Var36 = pp_Var35[-3];
      p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
      if (0 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar79 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
          fVar124 = 0.0;
          if (fVar1 != 0.0) {
            fVar124 = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar79 * 4) = fVar124;
          lVar79 = lVar79 + 1;
          p_Var36 = pp_Var35[-3];
          p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
        } while (lVar79 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1e4 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x1a8),local_1f0);
        pLVar38 = this->activation;
        if (pLVar38 != (Layer *)0x0) {
          (*pLVar38->_vptr_Layer[9])(pLVar38,pMVar65,pOVar64);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x280),
                   (Mat *)(p_Var66 + 0x1a8),*(int *)(p_Var66 + 0x10c),(Mat *)(p_Var66 + 0x110),
                   local_1f0);
      }
      piVar34 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar108 = bottom_blob_bordered.c;
    iVar92 = top_blob_int32.c;
    iVar91 = top_blob_int32.w;
    iVar95 = 0;
    opt_q.blob_allocator =
         (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
    if ((iVar84 == 1) &&
       (opt_q.blob_allocator =
             (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
       iVar33 == 1)) {
      if (((local_1f0->use_winograd_convolution == true) &&
          (((p_Var66 = this->_vptr_Convolution_x86[-3],
            *(int *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3 &&
            (*(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         ((((*(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var66 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var66) == 1)) &&
          ((0xf < iVar32 &&
           (0xf < *(int *)(p_Var66 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))))) {
        conv3x3s1_winograd23_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_3x3_winograd23_int8,
                   local_1f0);
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_weight_fp16_storage = false;
        opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var35 = this->_vptr_Convolution_x86;
        p_Var36 = pp_Var35[-3];
        p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
        if (0 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar79 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
            fVar124 = 0.0;
            if (fVar1 != 0.0) {
              fVar124 = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar79 * 4) = fVar124;
            lVar79 = lVar79 + 1;
            p_Var36 = pp_Var35[-3];
            p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
          } while (lVar79 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data
                                    ));
        }
        if (local_1e4 < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x1a8),local_1f0);
          pLVar38 = this->activation;
          if (pLVar38 != (Layer *)0x0) {
            (*pLVar38->_vptr_Layer[9])(pLVar38,local_1e0,local_1f0);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x280),
                     (Mat *)(p_Var66 + 0x1a8),*(int *)(p_Var66 + 0x10c),(Mat *)(p_Var66 + 0x110),
                     local_1f0);
        }
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        if ((local_1f0->use_sgemm_convolution == true) &&
           (((p_Var66 = this->_vptr_Convolution_x86[-3],
             *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(uint *)(p_Var66 + 0x1c + (long)&(this->weight_data_int8).data) < 2)))) {
          if (local_1e4 < 0x65) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var66 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar79 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar79 = lVar79 + 1;
                p_Var66 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86 +
                          (long)this->_vptr_Convolution_x86[-3]);
              } while (lVar79 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar84 = *(int *)(p_Var66 + 0xd4);
            iVar32 = *(int *)(p_Var66 + 0xd8);
            iVar95 = *(int *)(p_Var66 + 0xe4);
            iVar91 = *(int *)(p_Var66 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&opt_q);
            pOVar64 = local_1f0;
            conv_im2col_sgemm_int8_dequant_sse
                      (&bottom_blob_bordered,local_1e0,(Mat *)(p_Var66 + 0x160),iVar84,iVar32,iVar95
                       ,iVar91,(Mat *)(p_Var66 + 0x1a8),&local_a8,local_1f0);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var66 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar79 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
                }
                scale_out = **(float **)(p_Var66 + 0x280);
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&scale_out);
                }
                else {
                  *(float *)opt_q.blob_allocator = scale_out;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar79 = lVar79 + 1;
                p_Var66 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86 +
                          (long)this->_vptr_Convolution_x86[-3]);
              } while (lVar79 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar84 = *(int *)(p_Var66 + 0xd4);
            iVar32 = *(int *)(p_Var66 + 0xd8);
            iVar95 = *(int *)(p_Var66 + 0xe4);
            iVar91 = *(int *)(p_Var66 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&opt_q);
            pOVar64 = local_1f0;
            conv_im2col_sgemm_int8_requant_sse
                      (&bottom_blob_bordered,local_1e0,(Mat *)(p_Var66 + 0x160),iVar84,iVar32,iVar95
                       ,iVar91,(Mat *)(p_Var66 + 0x1a8),&local_90,local_1f0);
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          pMVar65 = local_1e0;
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
          pLVar38 = this->activation;
          iVar95 = 0;
          if (pLVar38 != (Layer *)0x0) {
            (*pLVar38->_vptr_Layer[9])(pLVar38,pMVar65,pOVar64);
          }
          goto LAB_001725c2;
        }
        p_Var66 = this->_vptr_Convolution_x86[-3];
        iVar84 = *(int *)(p_Var66 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar32 = *(int *)(p_Var66 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar95 = *(int *)(p_Var66 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        iVar33 = *(int *)(p_Var66 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_200 = (void *)(long)*(int *)(p_Var66 + 0x44 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var66);
        _w = CONCAT44(uStack_1f4,bottom_blob_bordered.w);
        uVar75 = (ulong)(uint)bottom_blob_bordered.c;
        lVar79 = (long)top_blob_int32.w;
        local_208 = (void *)(ulong)(uint)top_blob_int32.h;
        uVar67 = (ulong)(uint)top_blob_int32.c;
        uVar76 = iVar84 * iVar32;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                   (allocator_type *)&local_20c);
        if (0 < iVar32) {
          iVar111 = 0;
          iVar112 = 0;
          iVar73 = 0;
          do {
            if (0 < iVar84) {
              lVar81 = 0;
              do {
                *(int *)(opt_q._0_8_ + (long)iVar111 * 4 + lVar81 * 4) = iVar73;
                iVar73 = iVar73 + iVar95;
                lVar81 = lVar81 + 1;
              } while (iVar84 != (int)lVar81);
              iVar111 = iVar111 + (int)lVar81;
            }
            iVar73 = iVar73 + (w * iVar33 - iVar95 * iVar84);
            iVar112 = iVar112 + 1;
          } while (iVar112 != iVar32);
        }
        if (0 < iVar92) {
          local_218 = 0;
          do {
            if (0 < (int)local_208) {
              local_228 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * local_218 +
                                  (long)top_blob_int32.data);
              lVar81 = *(long *)(p_Var66 + 0x28 +
                                (long)&(this->weight_data_3x3_winograd23_int8).data);
              local_1d8 = (void *)0x0;
              do {
                if (0 < iVar91) {
                  _w = (long)local_1d8 * (long)local_1d0;
                  lVar68 = 0;
                  do {
                    if (iVar108 < 1) {
                      iVar84 = 0;
                    }
                    else {
                      uVar82 = 0;
                      iVar84 = 0;
                      lVar88 = (int)(iVar108 * uVar76 * (int)local_218) + lVar81;
                      do {
                        if (0 < (int)uVar76) {
                          uVar74 = 0;
                          do {
                            iVar84 = iVar84 + (int)*(char *)(lVar88 + uVar74) *
                                              (int)*(char *)((long)bottom_blob_bordered.data +
                                                            (long)*(int *)(opt_q._0_8_ + uVar74 * 4)
                                                            + bottom_blob_bordered.elemsize *
                                                              bottom_blob_bordered.cstep * uVar82 +
                                                              lVar68 * (long)local_200 +
                                                              _w * bottom_blob_bordered.elemsize *
                                                              (long)bottom_blob_bordered.w);
                            uVar74 = uVar74 + 1;
                          } while (uVar76 != uVar74);
                        }
                        lVar88 = lVar88 + (int)uVar76;
                        uVar82 = uVar82 + 1;
                      } while (uVar82 != uVar75);
                    }
                    *(int *)((long)local_228 + lVar68 * 4) = iVar84;
                    lVar68 = lVar68 + 1;
                  } while (lVar68 != lVar79);
                }
                local_228 = (void *)((long)local_228 + lVar79 * 4);
                local_1d8 = (void *)((long)local_1d8 + 1);
              } while (local_1d8 != local_208);
            }
            local_218 = local_218 + 1;
          } while (local_218 != uVar67);
        }
        if (opt_q._0_8_ != 0) {
          operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
        }
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_weight_fp16_storage = false;
        opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pMVar65 = local_1e0;
        pOVar64 = local_1f0;
        pp_Var35 = this->_vptr_Convolution_x86;
        p_Var36 = pp_Var35[-3];
        p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
        if (0 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar79 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var66 + 0x1f0) + lVar79 * 4);
            fVar124 = 0.0;
            if (fVar1 != 0.0) {
              fVar124 = 1.0 / (fVar1 * **(float **)(p_Var66 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar79 * 4) = fVar124;
            lVar79 = lVar79 + 1;
            p_Var36 = pp_Var35[-3];
            p_Var66 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var36);
          } while (lVar79 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data
                                    ));
        }
        if (local_1e4 < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x1a8),local_1f0);
          pLVar38 = this->activation;
          if (pLVar38 != (Layer *)0x0) {
            (*pLVar38->_vptr_Layer[9])(pLVar38,pMVar65,pOVar64);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e0,(Mat *)&opt_q,(Mat *)(p_Var66 + 0x280),
                     (Mat *)(p_Var66 + 0x1a8),*(int *)(p_Var66 + 0x10c),(Mat *)(p_Var66 + 0x110),
                     local_1f0);
        }
        piVar34 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 == 0) {
            if (opt_q._32_8_ == 0) {
              if (opt_q._0_8_ != 0) {
                free((void *)opt_q._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
      iVar95 = 0;
    }
  }
LAB_001725c2:
  piVar34 = (int *)CONCAT44(top_blob_int32.refcount._4_4_,top_blob_int32.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (top_blob_int32.allocator == (Allocator *)0x0) {
        if (top_blob_int32.data != (void *)0x0) {
          free(top_blob_int32.data);
        }
      }
      else {
        (*(top_blob_int32.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001725fe:
  piVar34 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_)
  ;
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return iVar95;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}